

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_ellbvp.h
# Opt level: O3

void __thiscall
lf::uscalfe::
MassEdgeMatrixProvider<double,_lf::mesh::utils::MeshFunctionAT<double>,_lf::base::PredicateTrue>::
MassEdgeMatrixProvider
          (MassEdgeMatrixProvider<double,_lf::mesh::utils::MeshFunctionAT<double>,_lf::base::PredicateTrue>
           *this,long *fe_space,QuadRule *param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ScalarReferenceFiniteElement<double> *fe;
  stringstream ss;
  string local_240;
  string local_220;
  string local_200;
  QuadRule local_1e0;
  PrecomputedScalarReferenceFiniteElement<double> local_1b0 [3];
  
  this->_vptr_MassEdgeMatrixProvider = (_func_int **)&PTR__MassEdgeMatrixProvider_0052b0b8;
  (this->fe_precomp_).qr_.ref_el_ = 0;
  *(undefined3 *)&(this->fe_precomp_).qr_.field_0x1 = 0;
  (this->fe_precomp_).qr_.degree_ = 0;
  (this->fe_precomp_).qr_.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->fe_precomp_).qr_.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->fe_precomp_).qr_.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->fe_precomp_).qr_.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->fe_precomp_).qr_.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->fe_precomp_).shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->fe_precomp_).shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->fe_precomp_).shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->fe_precomp_).grad_shape_fun_.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->fe_precomp_).grad_shape_fun_.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->fe_precomp_).grad_shape_fun_.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->fe_precomp_).super_ScalarReferenceFiniteElement<double>._vptr_ScalarReferenceFiniteElement
       = (_func_int **)&PTR__PrecomputedScalarReferenceFiniteElement_0052b438;
  (this->fe_precomp_).fe_ = (ScalarReferenceFiniteElement<double> *)0x0;
  quad::QuadRule::QuadRule(&(this->fe_precomp_).qr_);
  (this->fe_precomp_).grad_shape_fun_.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->fe_precomp_).grad_shape_fun_.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->fe_precomp_).shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->fe_precomp_).grad_shape_fun_.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->fe_precomp_).shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->fe_precomp_).shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  fe = *(ScalarReferenceFiniteElement<double> **)(*fe_space + 0x28);
  if (fe == (ScalarReferenceFiniteElement<double> *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0[0].qr_,"No shape functions specified for edges",0x26);
    paVar1 = &local_220.field_2;
    local_220._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"fe != nullptr","");
    paVar2 = &local_240.field_2;
    local_240._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_220,&local_240,0x1ac,&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar1) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    local_220._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"false","");
    local_240._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,"");
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
    base::AssertionFailed(&local_220,&local_240,0x1ac,&local_200);
  }
  else {
    if ((param_3->ref_el_).type_ == kSegment) {
      quad::QuadRule::QuadRule(&local_1e0,param_3);
      PrecomputedScalarReferenceFiniteElement<double>::PrecomputedScalarReferenceFiniteElement
                (local_1b0,fe,&local_1e0);
      PrecomputedScalarReferenceFiniteElement<double>::operator=(&this->fe_precomp_,local_1b0);
      PrecomputedScalarReferenceFiniteElement<double>::~PrecomputedScalarReferenceFiniteElement
                (local_1b0);
      free(local_1e0.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_1e0.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0[0].qr_,"Quadrature rule not meant for EDGE entities!",0x2c);
    paVar1 = &local_220.field_2;
    local_220._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,"quadrule.RefEl() == base::RefEl::kSegment()","");
    paVar2 = &local_240.field_2;
    local_240._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_220,&local_240,0x1ae,&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar1) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    local_220._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"false","");
    local_240._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,"");
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
    base::AssertionFailed(&local_220,&local_240,0x1ae,&local_200);
  }
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  abort();
}

Assistant:

MassEdgeMatrixProvider(
      std::shared_ptr<const UniformScalarFESpace<SCALAR>> fe_space, COEFF gamma,
      lf::quad::QuadRule quadrule,
      EDGESELECTOR edge_selector = base::PredicateTrue{})
      : gamma_(std::move(gamma)),
        edge_sel_(std::move(edge_selector)),
        fe_precomp_() {
    auto fe = fe_space->ShapeFunctionLayout(base::RefEl::kSegment());
    LF_ASSERT_MSG(fe != nullptr, "No shape functions specified for edges");
    LF_ASSERT_MSG(quadrule.RefEl() == base::RefEl::kSegment(),
                  "Quadrature rule not meant for EDGE entities!");
    // Precompute entity-independent quantities
    fe_precomp_ = PrecomputedScalarReferenceFiniteElement(fe, quadrule);
  }